

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int extraout_EAX;
  undefined7 uVar17;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  void *__optval;
  ssize_t sVar14;
  int *piVar15;
  cmsghdr *__cmsg;
  time_t tVar16;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  char (*pacVar21) [19];
  byte *pbVar22;
  __u32 frames;
  uint uVar23;
  char (*__dest) [17];
  uint *puVar24;
  char **ppcVar25;
  size_t sVar26;
  long lVar27;
  long lVar28;
  if_info *piVar29;
  bool bVar30;
  int rcvbuf_size;
  can_err_mask_t err_mask;
  int join_filter;
  can_raw_vcid_options vcid_opts;
  epoll_event event_setup;
  timeval tv;
  msghdr msg;
  time_t currtime;
  ifreq ifr;
  iovec iov;
  epoll_event events_pending [16];
  char ctrlmsg [120];
  tm now;
  char fname [83];
  int local_364;
  uint local_360;
  uint local_35c;
  byte *local_358;
  FILE *local_350;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  ulong local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined8 local_320;
  char **local_318;
  if_info *local_310;
  undefined8 local_308;
  long local_300;
  undefined4 local_2f4;
  ulong local_2f0;
  undefined1 local_2e8 [8];
  epoll_data_t local_2e0;
  timeval local_2d8;
  msghdr local_2c0;
  sockaddr local_288;
  undefined8 local_278;
  time_t local_270;
  timeval local_268;
  int local_258 [10];
  iovec local_230;
  char local_220 [16];
  int local_210;
  epoll_event local_1f8 [12];
  cmsghdr local_138 [11];
  byte local_88 [88];
  
  local_2e0.fd = 0;
  local_2e8._0_4_ = 1;
  local_2e8._4_4_ = 0;
  bVar6 = 0;
  local_364 = 0;
  local_288.sa_family = 0x1d;
  local_288.sa_data[0] = '\0';
  local_288.sa_data[1] = '\0';
  local_288.sa_data[2] = '\0';
  local_288.sa_data[3] = '\0';
  local_288.sa_data[4] = '\0';
  local_288.sa_data[5] = '\0';
  local_288.sa_data[6] = '\0';
  local_288.sa_data[7] = '\0';
  local_288.sa_data[8] = '\0';
  local_288.sa_data[9] = '\0';
  local_288.sa_data[10] = '\0';
  local_288.sa_data[0xb] = '\0';
  local_288.sa_data[0xc] = '\0';
  local_288.sa_data[0xd] = '\0';
  local_278 = 0;
  local_2f4 = 4;
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  local_268.tv_sec = 0;
  local_268.tv_usec = 0;
  local_318 = argv;
  progname = __xpg_basename(*argv);
  uVar17 = (undefined7)((ulong)progname >> 8);
  local_328 = (undefined4)CONCAT71(uVar17,0x61);
  local_324 = (undefined4)CONCAT71(uVar17,1);
  local_300 = 0xffffffff;
  uVar20 = CONCAT71((uint7)(uint3)((uint)argc >> 8),0x2a);
  bVar2 = false;
  bVar30 = false;
  local_33c = 0;
  local_320 = 0;
  local_308 = 0;
  local_358 = (byte *)0x0;
  local_350 = (FILE *)0x0;
  local_35c = 0;
  bVar5 = false;
LAB_00102aa6:
  do {
    while( true ) {
      bVar1 = bVar5;
      uVar10 = (uint)uVar20;
      iVar8 = argc;
      iVar7 = getopt(argc,local_318,"t:HciaSs:lf:Ln:r:Dde8xT:h?");
      bVar5 = bVar1;
      if (0x52 < iVar7) break;
      if (iVar7 < 0x48) {
        if (iVar7 == 0x38) {
          bVar6 = bVar6 | 0x20;
        }
        else {
          if (iVar7 != 0x44) {
            if (iVar7 == -1) {
              if (_optind == argc) goto LAB_00103ceb;
              if (bVar6 != 0 && bVar30) {
                main_cold_13();
                running = 0;
                signal_num = iVar8;
                return extraout_EAX;
              }
              bVar5 = bVar30;
              if (local_358 != (byte *)0x0 && bVar2) {
                uVar19 = *local_358 - 0x2d;
                if (uVar19 == 0) {
                  uVar19 = (uint)local_358[1];
                }
                if (uVar19 == 0) {
                  bVar2 = false;
                }
                bVar5 = true;
                if (uVar19 != 0) {
                  bVar5 = bVar30;
                }
              }
              if ((char)uVar20 == '*') {
                if (bVar2) {
                  fwrite("Disabled standard output while logging.\n",0x28,1,_stderr);
                  uVar10 = (uint)CONCAT71((int7)(uVar20 >> 8),2);
                }
                else {
                  uVar10 = 0;
                }
              }
              uVar19 = argc - _optind;
              if (0x10 < (int)uVar19) {
                main_cold_12();
                goto LAB_00103ca8;
              }
              local_360 = uVar10;
              iVar8 = epoll_create(1);
              if (iVar8 < 0) {
                perror("epoll_create");
                return 1;
              }
              local_2f0 = (ulong)uVar19;
              local_340 = iVar8;
              if ((int)uVar19 < 1) goto LAB_0010323e;
              local_344 = CONCAT31(local_344._1_3_,((char)local_35c != '\0' || bVar2) || bVar5);
              uVar20 = 0;
              goto LAB_00102d69;
            }
            goto switchD_00102acd_caseD_62;
          }
          local_324 = 0;
        }
      }
      else {
        bVar5 = true;
        if (iVar7 != 0x48) {
          if (iVar7 != 0x4c) goto switchD_00102acd_caseD_62;
          bVar30 = true;
          bVar5 = bVar1;
        }
      }
    }
    uVar17 = (undefined7)
             ((ulong)((long)&switchD_00102acd::switchdataD_00106020 +
                     (long)(int)(&switchD_00102acd::switchdataD_00106020)[iVar7 - 0x61]) >> 8);
    switch(iVar7) {
    case 0x61:
      bVar6 = bVar6 | 1;
      break;
    case 0x62:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_00102acd_caseD_62;
    case 99:
      local_320 = CONCAT71((int7)((ulong)local_320 >> 8),(char)local_320 + '\x01');
      break;
    case 100:
      local_350 = (FILE *)CONCAT71(uVar17,1);
      break;
    case 0x65:
      bVar6 = bVar6 | 8;
      break;
    case 0x66:
      local_358 = _optarg;
    case 0x6c:
      bVar2 = true;
      break;
    case 0x69:
      bVar6 = bVar6 | 2;
      break;
    case 0x6e:
      iVar8 = atoi((char *)_optarg);
      local_33c = iVar8;
      goto LAB_00102bcb;
    case 0x72:
      iVar8 = atoi((char *)_optarg);
      local_364 = iVar8;
LAB_00102bcb:
      if (iVar8 < 1) goto switchD_00102acd_caseD_62;
      break;
    case 0x73:
      uVar10 = atoi((char *)_optarg);
      uVar20 = (ulong)uVar10;
      if (2 < (uVar10 & 0xff)) goto switchD_00102acd_caseD_62;
      break;
    case 0x74:
      bVar18 = *_optarg;
      if ((0x39 < bVar18 - 0x41) ||
         (local_35c = (uint)bVar18, (0x200000900000001U >> ((ulong)(bVar18 - 0x41) & 0x3f) & 1) == 0
         )) {
        main_cold_1();
        local_35c = 0;
      }
      local_328 = 0x61;
      if (bVar18 == 0x7a) {
        local_328 = 0x7a;
      }
      break;
    case 0x78:
      local_308 = CONCAT71(uVar17,1);
      break;
    default:
      if (iVar7 != 0x53) {
        if (iVar7 == 0x54) goto code_r0x00102b28;
        goto switchD_00102acd_caseD_62;
      }
      bVar6 = bVar6 | 4;
    }
  } while( true );
code_r0x00102b28:
  piVar11 = __errno_location();
  *piVar11 = 0;
  local_300 = strtol((char *)_optarg,(char **)0x0,0);
  if (*piVar11 != 0) {
switchD_00102acd_caseD_62:
    print_usage();
    exit(1);
  }
  goto LAB_00102aa6;
LAB_00102d69:
  do {
    pbVar22 = (byte *)local_318[(long)(int)uVar20 + (long)_optind];
    local_330 = uVar20;
    pcVar12 = strchr((char *)pbVar22,0x2c);
    iVar7 = socket(0x1d,3,1);
    sock_info[uVar20].s = iVar7;
    if (iVar7 < 0) {
      pcVar12 = "socket";
      goto LAB_00103ca3;
    }
    piVar29 = sock_info + uVar20;
    unique0x10001490 = piVar29;
    iVar7 = epoll_ctl(iVar8,1,iVar7,(epoll_event *)local_2e8);
    if (iVar7 != 0) {
      pcVar12 = "failed to add socket to epoll";
      goto LAB_00103ca3;
    }
    sock_info[uVar20].cmdlinename = (char *)pbVar22;
    if (pcVar12 == (char *)0x0) {
      sVar26 = strlen((char *)pbVar22);
      iVar7 = (int)sVar26;
    }
    else {
      iVar7 = (int)pcVar12 - (int)pbVar22;
    }
    if (0xf < iVar7) {
      pcVar12 = "name of CAN device \'%s\' is too long!\n";
LAB_00103bc6:
      fprintf(_stderr,pcVar12,pbVar22);
      goto LAB_00103ca8;
    }
    if (max_devname_len < iVar7) {
      max_devname_len = iVar7;
    }
    local_258[0] = 0;
    local_258[1] = 0;
    local_258[2] = 0;
    local_258[3] = 0;
    strncpy((char *)local_258,(char *)pbVar22,(long)iVar7);
    iVar7 = 0;
    if (local_258[0] != 0x796e61) {
      iVar9 = ioctl(piVar29->s,0x8933,local_258);
      iVar7 = local_258[4];
      if (iVar9 < 0) {
LAB_00103ce6:
        main_cold_2();
LAB_00103ceb:
        print_usage();
        exit(0);
      }
    }
    local_288.sa_data._2_4_ = iVar7;
    if (pcVar12 != (char *)0x0) {
      sVar26 = 0;
      pcVar13 = pcVar12;
      do {
        pcVar13 = strchr(pcVar13 + 1,0x2c);
        sVar26 = sVar26 + 8;
      } while (pcVar13 != (char *)0x0);
      __optval = malloc(sVar26);
      if (__optval == (void *)0x0) {
        main_cold_3();
        goto LAB_00103ca8;
      }
      iVar7 = 0;
      local_338 = 0;
      local_334 = 0;
      local_310 = piVar29;
      do {
        pbVar22 = (byte *)(pcVar12 + 1);
        pcVar13 = strchr((char *)pbVar22,0x2c);
        puVar24 = (uint *)((long)iVar7 * 8 + (long)__optval);
        lVar27 = (long)__optval + (long)iVar7 * 8 + 4;
        iVar8 = __isoc99_sscanf(pbVar22,"%x:%x",puVar24,lVar27);
        if (iVar8 == 2) {
          *(byte *)(lVar27 + 3) = *(byte *)(lVar27 + 3) & 0xdf;
          if (pcVar12[9] == ':') {
            *(byte *)((long)puVar24 + 3) = *(byte *)((long)puVar24 + 3) | 0x80;
          }
          iVar7 = iVar7 + 1;
        }
        else {
          iVar8 = __isoc99_sscanf(pbVar22,"%x~%x",puVar24,lVar27);
          if (iVar8 == 2) {
            uVar10 = *puVar24;
            *puVar24 = uVar10 | 0x20000000;
            *(byte *)((long)puVar24 + 7) = *(byte *)((long)puVar24 + 7) & 0xdf;
            if (pcVar12[9] == '~') {
              *puVar24 = uVar10 | 0xa0000000;
            }
            iVar7 = iVar7 + 1;
          }
          else if ((*pbVar22 | 0x20) == 0x6a) {
            local_334 = 1;
          }
          else {
            iVar8 = __isoc99_sscanf(pbVar22,"#%x",&local_338);
            if (iVar8 != 1) {
              pcVar12 = "Error in filter option parsing: \'%s\'\n";
              goto LAB_00103bc6;
            }
          }
        }
        piVar29 = local_310;
        pcVar12 = pcVar13;
      } while (pcVar13 != (char *)0x0);
      if (local_338 != 0) {
        setsockopt(local_310->s,0x65,2,&local_338,4);
      }
      iVar8 = local_340;
      if (local_334 != 0) {
        iVar9 = setsockopt(piVar29->s,0x65,6,&local_334,4);
        if (iVar9 < 0) {
          pcVar12 = "setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel";
          goto LAB_00103ca3;
        }
      }
      if (iVar7 != 0) {
        setsockopt(piVar29->s,0x65,1,__optval,iVar7 << 3);
      }
      free(__optval);
    }
    setsockopt(piVar29->s,0x65,5,&canfx_on,4);
    setsockopt(piVar29->s,0x65,7,&canfx_on,4);
    setsockopt(piVar29->s,0x65,8,&local_2f4,4);
    if (local_364 != 0) {
      local_138[0].cmsg_len._0_4_ = 4;
      iVar7 = setsockopt(piVar29->s,1,0x21,&local_364,4);
      if (iVar7 < 0) {
        iVar7 = setsockopt(piVar29->s,1,8,&local_364,4);
        if (iVar7 < 0) {
          pcVar12 = "setsockopt SO_RCVBUF";
          goto LAB_00103ca3;
        }
        iVar7 = getsockopt(piVar29->s,1,8,local_1f8,(socklen_t *)local_138);
        if (iVar7 < 0) {
          pcVar12 = "getsockopt SO_RCVBUF";
          goto LAB_00103ca3;
        }
        if ((local_330 == 0) && ((int)local_1f8[0].events < local_364 * 2)) {
          main_cold_4();
        }
      }
    }
    if ((byte)local_344 != '\0') {
      if (bVar1) {
        local_1f8[0].events = 0x58;
        iVar7 = setsockopt(piVar29->s,1,0x25,local_1f8,4);
        if (iVar7 < 0) {
          pcVar12 = "setsockopt SO_TIMESTAMPING is not supported by your Linux kernel";
          goto LAB_00103ca3;
        }
      }
      else {
        local_1f8[0].events = 1;
        iVar7 = setsockopt(piVar29->s,1,0x1d,local_1f8,4);
        if (iVar7 < 0) {
          pcVar12 = "setsockopt SO_TIMESTAMP";
          goto LAB_00103ca3;
        }
      }
    }
    if ((char)local_350 != '\0') {
      local_1f8[0].events = 1;
      iVar7 = setsockopt(piVar29->s,1,0x28,local_1f8,4);
      if (iVar7 < 0) {
        pcVar12 = "setsockopt SO_RXQ_OVFL not supported by your Linux Kernel";
        goto LAB_00103ca3;
      }
    }
    iVar7 = bind(piVar29->s,&local_288,0x18);
    if (iVar7 < 0) {
      pcVar12 = "bind";
      goto LAB_00103ca3;
    }
    uVar20 = local_330 + 1;
  } while (uVar20 != local_2f0);
LAB_0010323e:
  if (bVar2) {
    if (local_358 == (byte *)0x0) {
      tVar16 = time(&local_270);
      if (tVar16 != -1) {
        local_358 = local_88;
        main_cold_6();
        goto LAB_00103c16;
      }
      pcVar12 = "time";
    }
    else {
LAB_00103c16:
      if ((char)local_360 != '\x02') {
        main_cold_5();
      }
      pbVar22 = local_358;
      fprintf(_stderr,"Enabling Logfile \'%s\'\n",local_358);
      local_350 = fopen((char *)pbVar22,"w");
      if (local_350 != (FILE *)0x0) goto LAB_00103252;
      pcVar12 = "logfile";
    }
LAB_00103ca3:
    perror(pcVar12);
LAB_00103ca8:
    iVar8 = 1;
  }
  else {
    local_350 = (FILE *)0x0;
LAB_00103252:
    local_2c0.msg_iov = &local_230;
    local_230.iov_base = &main::cu;
    local_2c0.msg_name = &local_288;
    local_2c0.msg_iovlen = 1;
    local_2c0.msg_control = local_138;
    if (running != 0) {
      bVar30 = (char)local_360 == '\0';
      local_358 = (byte *)0x106140;
      local_310 = (if_info *)0x10658a;
      if ((byte)local_320 == 1) {
        local_310 = (if_info *)0x106140;
      }
      if ((byte)local_320 < 2) {
        local_358 = (byte *)0x10658a;
      }
      local_344 = (int)local_320 + -1;
      local_330 = local_330 & 0xffffffff00000000;
      do {
        uVar10 = epoll_wait(iVar8,local_1f8,uVar19,(int)local_300);
        if (uVar10 == 0xffffffff) {
          piVar11 = __errno_location();
          if (*piVar11 != 4) goto LAB_00103a8b;
        }
        else if ((uVar10 == 0) && (-1 < (int)local_300)) {
LAB_00103a8b:
          running = 0;
        }
        else if (0 < (int)uVar10) {
          local_318 = (char **)(ulong)uVar10;
          ppcVar25 = (char **)0x0;
          do {
            piVar11 = *(int **)(&local_1f8[0].field_0x4 + (long)ppcVar25 * 0xc);
            local_230.iov_len = 0x810;
            local_2c0.msg_namelen = 0x18;
            local_2c0.msg_controllen = 0x78;
            local_2c0.msg_flags = 0;
            sVar14 = recvmsg(*piVar11,&local_2c0,0);
            uVar4 = local_288.sa_data._2_4_;
            iVar7 = *piVar11;
            piVar15 = dindex;
            lVar27 = 0;
            do {
              iVar8 = local_340;
              if (*piVar15 == local_288.sa_data._2_4_) goto LAB_001034be;
              lVar27 = lVar27 + 1;
              piVar15 = piVar15 + 1;
            } while (lVar27 != 0x1e);
            lVar27 = 0;
            do {
              if (*(int *)((long)dindex + lVar27) != 0) {
                local_210 = *(int *)((long)dindex + lVar27);
                iVar8 = ioctl(iVar7,0x8910,local_220);
                if (iVar8 < 0) {
                  *(undefined4 *)((long)dindex + lVar27) = 0;
                }
              }
              uVar3 = local_288._0_8_;
              lVar27 = lVar27 + 4;
            } while (lVar27 != 0x78);
            piVar15 = dindex;
            __dest = devname;
            lVar27 = 0;
            while (*piVar15 != 0) {
              lVar27 = lVar27 + 1;
              __dest = __dest + 1;
              piVar15 = piVar15 + 1;
              if (lVar27 == 0x1e) {
                main_cold_7();
                goto LAB_00103ce6;
              }
            }
            *piVar15 = uVar4;
            local_288.sa_data[2] = (char)uVar4;
            local_288.sa_data[3] = SUB41(uVar4,1);
            local_288.sa_data[4] = SUB41(uVar4,2);
            local_288.sa_data[5] = SUB41(uVar4,3);
            local_210._0_1_ = local_288.sa_data[2];
            local_210._1_1_ = local_288.sa_data[3];
            local_210._2_1_ = local_288.sa_data[4];
            local_210._3_1_ = local_288.sa_data[5];
            local_288._0_8_ = uVar3;
            iVar8 = ioctl(iVar7,0x8910,local_220);
            if (iVar8 < 0) {
              perror("SIOCGIFNAME");
            }
            iVar7 = max_devname_len;
            sVar26 = strlen(local_220);
            iVar8 = local_340;
            if (iVar7 < (int)sVar26) {
              max_devname_len = (int)sVar26;
            }
            strcpy(*__dest,local_220);
LAB_001034be:
            uVar10 = (uint)sVar14;
            if ((int)uVar10 < 0) {
              piVar11 = __errno_location();
              if ((*piVar11 != 100) || ((char)local_324 != '\0')) {
                pcVar12 = "read";
                goto LAB_00103ca3;
              }
              main_cold_11();
            }
            else {
              if (uVar10 < 0xd) {
                main_cold_10();
                goto LAB_00103ca8;
              }
              if ((char)main::cu.fd.len < '\0') {
                if (main::cu.xl.len + 0xc != uVar10) {
                  main_cold_8();
                  goto LAB_00103ca8;
                }
              }
              else if ((uVar10 & 0x7fffffff) == 0x10) {
                main::cu.cc.__pad = '\0';
              }
              else {
                if ((uVar10 & 0x7fffffff) != 0x48) {
                  main_cold_9();
                  goto LAB_00103ca8;
                }
                main::cu.cc.__pad = main::cu.cc.__pad | 4;
              }
              if (local_33c == 0) {
                local_33c = 0;
              }
              else {
                local_33c = local_33c + -1;
                if (local_33c == 0) {
                  running = 0;
                  local_33c = 0;
                }
              }
              __cmsg = (cmsghdr *)local_2c0.msg_control;
              if ((cmsghdr *)local_2c0.msg_control != (cmsghdr *)0x0 &&
                  0xf < local_2c0.msg_controllen) {
                do {
                  if (__cmsg->cmsg_level != 1) break;
                  iVar7 = __cmsg->cmsg_type;
                  if (iVar7 == 0x28) {
                    piVar11[4] = (int)__cmsg[1].cmsg_len;
                  }
                  else if (iVar7 == 0x25) {
                    local_2d8.tv_sec = __cmsg[3].cmsg_len;
                    local_2d8.tv_usec = *(long *)&__cmsg[3].cmsg_level / 1000;
                  }
                  else if (iVar7 == 0x1d) {
                    local_2d8.tv_sec = __cmsg[1].cmsg_len;
                    local_2d8.tv_usec._0_4_ = __cmsg[1].cmsg_level;
                    local_2d8.tv_usec._4_4_ = __cmsg[1].cmsg_type;
                  }
                  __cmsg = __cmsg_nxthdr(&local_2c0,__cmsg);
                } while (__cmsg != (cmsghdr *)0x0);
              }
              uVar10 = piVar11[4];
              uVar23 = uVar10 - piVar11[5];
              iVar7 = (int)lVar27;
              if (uVar23 != 0) {
                if ((char)local_360 != '\x02') {
                  pcVar12 = "";
                  if (1 < uVar23) {
                    pcVar12 = "s";
                  }
                  printf("DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                         (ulong)uVar23,pcVar12,devname + iVar7,(ulong)uVar10);
                  uVar10 = piVar11[4];
                }
                if (bVar2) {
                  pcVar12 = "";
                  if (1 < uVar23) {
                    pcVar12 = "s";
                  }
                  fprintf(local_350,
                          "DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                          (ulong)uVar23,pcVar12,devname + iVar7);
                  uVar10 = piVar11[4];
                }
                piVar11[5] = uVar10;
              }
              bVar18 = bVar6 | 0x10;
              if (-1 < (int)main::cu.cc.can_id) {
                bVar18 = bVar6;
              }
              pcVar12 = " T";
              if ((local_2c0.msg_flags & 4U) == 0) {
                pcVar12 = " R";
              }
              if ((char)local_308 == '\0') {
                pcVar12 = "";
              }
              if (bVar2 || bVar30 && bVar5) {
                main::alen = sprint_timestamp(main::afrbuf,(char)local_328,&local_2d8,&local_268);
                iVar9 = sprintf(main::afrbuf + (uint)main::alen,"%*s ",(ulong)(uint)max_devname_len,
                                devname + iVar7);
                lVar27 = (long)iVar9 + (long)main::alen;
                main::alen = (int)lVar27;
                iVar9 = snprintf_canframe(main::afrbuf + lVar27,0x189c - lVar27,&main::cu,0);
                main::alen = main::alen + iVar9;
                if (bVar2) {
                  fprintf(local_350,"%s%s\n",main::afrbuf,pcVar12);
                }
              }
              if (bVar30 && bVar5) {
                printf("%s%s\n",main::afrbuf,pcVar12);
              }
              else if ((char)local_360 == '\0') {
                pacVar21 = (char (*) [19])0x10658a;
                if (2 < (byte)local_320) {
                  pacVar21 = col_on + iVar7 % 6;
                }
                main::alen = sprintf(main::afrbuf," %s",pacVar21);
                iVar9 = sprint_timestamp(main::afrbuf + main::alen,(char)local_35c,&local_2d8,
                                         &local_268);
                lVar27 = (long)main::alen;
                main::alen = (int)(iVar9 + lVar27);
                pacVar21 = (char (*) [19])0x10658a;
                if ((byte)local_344 < 2) {
                  pacVar21 = col_on + iVar7 % 6;
                }
                iVar7 = sprintf(main::afrbuf + iVar9 + lVar27," %s%*s",pacVar21,
                                (ulong)(uint)max_devname_len,devname + iVar7);
                uVar20 = (long)iVar7 + (long)main::alen;
                main::alen = (int)uVar20;
                if ((char)local_308 != '\0') {
                  pcVar12 = "  TX %s";
                  if ((local_2c0.msg_flags & 4U) == 0) {
                    pcVar12 = "  RX %s";
                  }
                  iVar7 = sprintf(main::afrbuf + uVar20,pcVar12,
                                  extra_m_info + (main::cu.cc.__pad & 3));
                  main::alen = iVar7 + main::alen;
                  uVar20 = (ulong)(uint)main::alen;
                }
                iVar7 = sprintf(main::afrbuf + (int)uVar20,"%s  ",local_310);
                lVar27 = (long)iVar7 + (long)main::alen;
                main::alen = (int)lVar27;
                iVar7 = snprintf_long_canframe
                                  (main::afrbuf + lVar27,0x189c - lVar27,&main::cu,(uint)bVar18);
                lVar27 = (long)iVar7 + (long)main::alen;
                iVar7 = (int)lVar27;
                main::alen = iVar7;
                if (((bVar18 & 8) != 0) && ((main::cu.cc.can_id & 0x20000000) != 0)) {
                  main::afrbuf[lVar27 + 2] = '\0';
                  (main::afrbuf + lVar27)[0] = '\n';
                  (main::afrbuf + lVar27)[1] = '\t';
                  main::alen = iVar7 + 2;
                  iVar7 = snprintf_can_error_frame
                                    (main::afrbuf + (long)iVar7 + 2,0x189a - (long)iVar7,
                                     &main::cu.fd,"\n\t");
                  main::alen = main::alen + iVar7;
                }
                printf("%s%s\n",main::afrbuf,local_358);
              }
              else if ((local_360 & 0xff) == 1) {
                uVar10 = (uint)(byte)local_330;
                printf("%c\b",(ulong)(uint)(int)"|/-\\"[uVar10 & 3]);
                local_330 = CONCAT44(local_330._4_4_,(uVar10 & 3) + 1);
              }
              fflush(_stdout);
              bVar6 = bVar18;
            }
            ppcVar25 = (char **)((long)ppcVar25 + 1);
          } while (ppcVar25 != local_318);
        }
      } while (running != 0);
    }
    if (0 < (int)uVar19) {
      lVar27 = local_2f0 * 0x18;
      lVar28 = 0;
      do {
        close(*(int *)((long)&sock_info[0].s + lVar28));
        lVar28 = lVar28 + 0x18;
      } while (lVar27 != lVar28);
    }
    close(iVar8);
    if (bVar2) {
      fclose(local_350);
    }
    if (signal_num == 0) {
      iVar8 = 0;
    }
    else {
      iVar8 = signal_num + 0x80;
    }
  }
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
	int fd_epoll;
	struct epoll_event events_pending[MAXSOCK];
	struct epoll_event event_setup = {
		.events = EPOLLIN, /* prepare the common part */
	};
	unsigned char timestamp = 0;
	unsigned char logtimestamp = 'a';
	unsigned char hwtimestamp = 0;
	unsigned char down_causes_exit = 1;
	unsigned char dropmonitor = 0;
	unsigned char extra_msg_info = 0;
	unsigned char silent = SILENT_INI;
	unsigned char silentani = 0;
	unsigned char color = 0;
	unsigned char view = 0;
	unsigned char log = 0;
	unsigned char logfrmt = 0;
	int count = 0;
	int rcvbuf_size = 0;
	int opt, num_events;
	int currmax, numfilter;
	int join_filter;
	char *ptr, *nptr;
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_RX_FILTER,
		.rx_vcid = 0,
		.rx_vcid_mask = 0,
	};
	char ctrlmsg[CMSG_SPACE(sizeof(struct timeval)) +
		     CMSG_SPACE(3 * sizeof(struct timespec)) +
		     CMSG_SPACE(sizeof(__u32))];
	struct iovec iov;
	struct msghdr msg;
	struct cmsghdr *cmsg;
	struct can_filter *rfilter;
	can_err_mask_t err_mask;
	static cu_t cu; /* union for CAN CC/FD/XL frames */
	int nbytes, i;
	struct ifreq ifr;
	struct timeval tv, last_tv;
	int timeout_ms = -1; /* default to no timeout */
	FILE *logfile = NULL;
	char fname[83]; /* suggested by -Wformat-overflow= */
	const char *logname = NULL;
	static char afrbuf[AFRSZ]; /* ASCII CAN frame buffer size */
	static int alen;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	last_tv.tv_sec = 0;
	last_tv.tv_usec = 0;

	progname = basename(argv[0]);

	while ((opt = getopt(argc, argv, "t:HciaSs:lf:Ln:r:Dde8xT:h?")) != -1) {
		switch (opt) {
		case 't':
			timestamp = optarg[0];
			logtimestamp = optarg[0];
			if ((timestamp != 'a') && (timestamp != 'A') &&
			    (timestamp != 'd') && (timestamp != 'z')) {
				fprintf(stderr, "%s: unknown timestamp mode '%c' - ignored\n",
					progname, optarg[0]);
				timestamp = 0;
			}
			if ((logtimestamp != 'a') && (logtimestamp != 'z')) {
				logtimestamp = 'a';
			}
			break;

		case 'H':
			hwtimestamp = 1;
			break;

		case 'c':
			color++;
			break;

		case 'i':
			view |= CANLIB_VIEW_BINARY;
			break;

		case 'a':
			view |= CANLIB_VIEW_ASCII;
			break;

		case 'S':
			view |= CANLIB_VIEW_SWAP;
			break;

		case 'e':
			view |= CANLIB_VIEW_ERROR;
			break;

		case '8':
			view |= CANLIB_VIEW_LEN8_DLC;
			break;

		case 's':
			silent = atoi(optarg);
			if (silent > SILENT_ON) {
				print_usage();
				exit(1);
			}
			break;

		case 'l':
			log = 1;
			break;

		case 'D':
			down_causes_exit = 0;
			break;

		case 'd':
			dropmonitor = 1;
			break;

		case 'x':
			extra_msg_info = 1;
			break;

		case 'L':
			logfrmt = 1;
			break;

		case 'f':
			logname = optarg;
			log = 1;
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'r':
			rcvbuf_size = atoi(optarg);
			if (rcvbuf_size < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'T':
			errno = 0;
			timeout_ms = strtol(optarg, NULL, 0);
			if (errno != 0) {
				print_usage();
				exit(1);
			}
			break;
		default:
			print_usage();
			exit(1);
			break;
		}
	}

	if (optind == argc) {
		print_usage();
		exit(0);
	}

	if (logfrmt && view) {
		fprintf(stderr, "Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n");
		exit(0);
	}

	/* "-f -"  is equal to "-L" (print logfile format on stdout) */
	if (log && logname && strcmp("-", logname) == 0) {
		log = 0; /* no logging into a file */
		logfrmt = 1; /* print logformat output to stdout */
	}

	if (silent == SILENT_INI) {
		if (log) {
			fprintf(stderr, "Disabled standard output while logging.\n");
			silent = SILENT_ON; /* disable output on stdout */
		} else
			silent = SILENT_OFF; /* default output */
	}

	currmax = argc - optind; /* find real number of CAN devices */

	if (currmax > MAXSOCK) {
		fprintf(stderr, "More than %d CAN devices given on commandline!\n", MAXSOCK);
		return 1;
	}

	fd_epoll = epoll_create(1);
	if (fd_epoll < 0) {
		perror("epoll_create");
		return 1;
	}

	for (i = 0; i < currmax; i++) {
		struct if_info *obj = &sock_info[i];
		ptr = argv[optind + i];
		nptr = strchr(ptr, ',');

		pr_debug("open %d '%s'.\n", i, ptr);

		obj->s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
		if (obj->s < 0) {
			perror("socket");
			return 1;
		}

		event_setup.data.ptr = obj; /* remember the instance as private data */
		if (epoll_ctl(fd_epoll, EPOLL_CTL_ADD, obj->s, &event_setup)) {
			perror("failed to add socket to epoll");
			return 1;
		}

		obj->cmdlinename = ptr; /* save pointer to cmdline name of this socket */

		if (nptr)
			nbytes = nptr - ptr; /* interface name is up the first ',' */
		else
			nbytes = strlen(ptr); /* no ',' found => no filter definitions */

		if (nbytes >= IFNAMSIZ) {
			fprintf(stderr, "name of CAN device '%s' is too long!\n", ptr);
			return 1;
		}

		if (nbytes > max_devname_len)
			max_devname_len = nbytes; /* for nice printing */

		memset(&ifr.ifr_name, 0, sizeof(ifr.ifr_name));
		strncpy(ifr.ifr_name, ptr, nbytes);

		pr_debug("using interface name '%s'.\n", ifr.ifr_name);

		if (strcmp(ANYDEV, ifr.ifr_name) != 0) {
			if (ioctl(obj->s, SIOCGIFINDEX, &ifr) < 0) {
				perror("SIOCGIFINDEX");
				exit(1);
			}
			addr.can_ifindex = ifr.ifr_ifindex;
		} else
			addr.can_ifindex = 0; /* any can interface */

		if (nptr) {
			/* found a ',' after the interface name => check for filters */

			/* determine number of filters to alloc the filter space */
			numfilter = 0;
			ptr = nptr;
			while (ptr) {
				numfilter++;
				ptr++; /* hop behind the ',' */
				ptr = strchr(ptr, ','); /* exit condition */
			}

			rfilter = malloc(sizeof(struct can_filter) * numfilter);
			if (!rfilter) {
				fprintf(stderr, "Failed to create filter space!\n");
				return 1;
			}

			numfilter = 0;
			err_mask = 0;
			join_filter = 0;

			while (nptr) {

				ptr = nptr + 1; /* hop behind the ',' */
				nptr = strchr(ptr, ','); /* update exit condition */

				if (sscanf(ptr, "%x:%x",
					   &rfilter[numfilter].can_id,
					   &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == ':')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (sscanf(ptr, "%x~%x",
						  &rfilter[numfilter].can_id,
						  &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_id |= CAN_INV_FILTER;
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == '~')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (*ptr == 'j' || *ptr == 'J') {
					join_filter = 1;
				} else if (sscanf(ptr, "#%x", &err_mask) != 1) {
					fprintf(stderr, "Error in filter option parsing: '%s'\n", ptr);
					return 1;
				}
			}

			if (err_mask)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_ERR_FILTER,
					   &err_mask, sizeof(err_mask));

			if (join_filter && setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_JOIN_FILTERS,
						      &join_filter, sizeof(join_filter)) < 0) {
				perror("setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel");
				return 1;
			}

			if (numfilter)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FILTER,
					   rfilter, numfilter * sizeof(struct can_filter));

			free(rfilter);

		} /* if (nptr) */

		/* try to switch the socket into CAN FD mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to switch the socket into CAN XL mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to enable the CAN XL VCID pass through mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS, &vcid_opts, sizeof(vcid_opts));

		if (rcvbuf_size) {
			int curr_rcvbuf_size;
			socklen_t curr_rcvbuf_size_len = sizeof(curr_rcvbuf_size);

			/* try SO_RCVBUFFORCE first, if we run with CAP_NET_ADMIN */
			if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUFFORCE,
				       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
				pr_debug("SO_RCVBUFFORCE failed so try SO_RCVBUF ...\n");
				if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
					perror("setsockopt SO_RCVBUF");
					return 1;
				}

				if (getsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &curr_rcvbuf_size, &curr_rcvbuf_size_len) < 0) {
					perror("getsockopt SO_RCVBUF");
					return 1;
				}

				/* Only print a warning the first time we detect the adjustment */
				/* n.b.: The wanted size is doubled in Linux in net/sore/sock.c */
				if (!i && curr_rcvbuf_size < rcvbuf_size * 2)
					fprintf(stderr, "The socket receive buffer size was "
						"adjusted due to /proc/sys/net/core/rmem_max.\n");
			}
		}

		if (timestamp || log || logfrmt) {
			if (hwtimestamp) {
				const int timestamping_flags = (SOF_TIMESTAMPING_SOFTWARE |
								SOF_TIMESTAMPING_RX_SOFTWARE |
								SOF_TIMESTAMPING_RAW_HARDWARE);

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMPING,
					       &timestamping_flags, sizeof(timestamping_flags)) < 0) {
					perror("setsockopt SO_TIMESTAMPING is not supported by your Linux kernel");
					return 1;
				}
			} else {
				const int timestamp_on = 1;

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMP,
					       &timestamp_on, sizeof(timestamp_on)) < 0) {
					perror("setsockopt SO_TIMESTAMP");
					return 1;
				}
			}
		}

		if (dropmonitor) {
			const int dropmonitor_on = 1;

			if (setsockopt(obj->s, SOL_SOCKET, SO_RXQ_OVFL,
				       &dropmonitor_on, sizeof(dropmonitor_on)) < 0) {
				perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
				return 1;
			}
		}

		if (bind(obj->s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
			perror("bind");
			return 1;
		}
	}

	if (log) {
		if (!logname) {
			time_t currtime;
			struct tm now;

			if (time(&currtime) == (time_t)-1) {
				perror("time");
				return 1;
			}

			localtime_r(&currtime, &now);

			snprintf(fname, sizeof(fname), "candump-%04d-%02d-%02d_%02d%02d%02d.log",
				now.tm_year + 1900,
				now.tm_mon + 1,
				now.tm_mday,
				now.tm_hour,
				now.tm_min,
				now.tm_sec);

			logname = fname;
		}

		if (silent != SILENT_ON)
			fprintf(stderr, "Warning: Console output active while logging!\n");

		fprintf(stderr, "Enabling Logfile '%s'\n", logname);

		logfile = fopen(logname, "w");
		if (!logfile) {
			perror("logfile");
			return 1;
		}
	}

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &cu;
	msg.msg_name = &addr;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	while (running) {
		num_events = epoll_wait(fd_epoll, events_pending, currmax, timeout_ms);
		if (num_events == -1) {
			if (errno != EINTR)
				running = 0;
			continue;
		}

		/* handle timeout */
		if (!num_events && timeout_ms >= 0) {
			running = 0;
			continue;
		}

		for (i = 0; i < num_events; i++) { /* check waiting CAN RAW sockets */
			struct if_info *obj = events_pending[i].data.ptr;
			int idx;
			char *extra_info = "";

			/* these settings may be modified by recvmsg() */
			iov.iov_len = sizeof(cu);
			msg.msg_namelen = sizeof(addr);
			msg.msg_controllen = sizeof(ctrlmsg);
			msg.msg_flags = 0;

			nbytes = recvmsg(obj->s, &msg, 0);
			idx = idx2dindex(addr.can_ifindex, obj->s);

			if (nbytes < 0) {
				if ((errno == ENETDOWN) && !down_causes_exit) {
					fprintf(stderr, "%s: interface down\n", devname[idx]);
					continue;
				}
				perror("read");
				return 1;
			}

			/* mark dual-use struct canfd_frame */
			if (nbytes < (int)CANXL_HDR_SIZE + CANXL_MIN_DLEN) {
				fprintf(stderr, "read: no CAN frame\n");
				return 1;
			}

			if (cu.xl.flags & CANXL_XLF) {
				if (nbytes != (int)CANXL_HDR_SIZE + cu.xl.len) {
					printf("nbytes = %d\n", nbytes);
					fprintf(stderr, "read: no CAN XL frame\n");
					return 1;
				}
			} else {
				if (nbytes == CAN_MTU)
					cu.fd.flags = 0;
				else if (nbytes == CANFD_MTU)
					cu.fd.flags |= CANFD_FDF;
				else {
					fprintf(stderr, "read: incomplete CAN CC/FD frame\n");
					return 1;
				}
			}

			if (count && (--count == 0))
				running = 0;

			for (cmsg = CMSG_FIRSTHDR(&msg);
			     cmsg && (cmsg->cmsg_level == SOL_SOCKET);
			     cmsg = CMSG_NXTHDR(&msg,cmsg)) {
				if (cmsg->cmsg_type == SO_TIMESTAMP) {
					memcpy(&tv, CMSG_DATA(cmsg), sizeof(tv));
				} else if (cmsg->cmsg_type == SO_TIMESTAMPING) {
					struct timespec *stamp = (struct timespec *)CMSG_DATA(cmsg);

					/*
					 * stamp[0] is the software timestamp
					 * stamp[1] is deprecated
					 * stamp[2] is the raw hardware timestamp
					 * See chapter 2.1.2 Receive timestamps in
					 * linux/Documentation/networking/timestamping.txt
					 */
					tv.tv_sec = stamp[2].tv_sec;
					tv.tv_usec = stamp[2].tv_nsec / 1000;
				} else if (cmsg->cmsg_type == SO_RXQ_OVFL) {
					memcpy(&obj->dropcnt, CMSG_DATA(cmsg), sizeof(__u32));
				}
			}

			/* check for (unlikely) dropped frames on this specific socket */
			if (obj->dropcnt != obj->last_dropcnt) {
				__u32 frames = obj->dropcnt - obj->last_dropcnt;

				if (silent != SILENT_ON)
					printf("DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
					       frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				if (log)
					fprintf(logfile, "DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
						frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				obj->last_dropcnt = obj->dropcnt;
			}

			/* once we detected a EFF frame indent SFF frames accordingly */
			if (cu.fd.can_id & CAN_EFF_FLAG)
				view |= CANLIB_VIEW_INDENT_SFF;

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					extra_info = " T";
				else
					extra_info = " R";
			}

			/* build common log format output */
			if ((log) || ((logfrmt) && (silent == SILENT_OFF))) {

				alen = sprint_timestamp(afrbuf, logtimestamp,
							  &tv, &last_tv);

				alen += sprintf(afrbuf + alen, "%*s ",
						  max_devname_len, devname[idx]);

				alen += snprintf_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, 0);
			}

			/* write CAN frame in log file style to logfile */
			if (log)
				fprintf(logfile, "%s%s\n", afrbuf, extra_info);

			/* print CAN frame in log file style to stdout */
			if ((logfrmt) && (silent == SILENT_OFF)) {
				printf("%s%s\n", afrbuf, extra_info);
				goto out_fflush; /* no other output to stdout */
			}

			/* print only animation */
			if (silent != SILENT_OFF) {
				if (silent == SILENT_ANI) {
					printf("%c\b", anichar[silentani %= MAXANI]);
					silentani++;
				}
				goto out_fflush; /* no other output to stdout */
			}

			/* print (colored) long CAN frame style to stdout */
			alen = sprintf(afrbuf, " %s", (color > 2) ? col_on[idx % MAXCOL] : "");
			alen += sprint_timestamp(afrbuf + alen, timestamp, &tv, &last_tv);
			alen += sprintf(afrbuf + alen, " %s%*s",
					  (color && (color < 3)) ? col_on[idx % MAXCOL] : "",
					  max_devname_len, devname[idx]);

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					alen += sprintf(afrbuf + alen, "  TX %s",
							  extra_m_info[cu.fd.flags & 3]);
				else
					alen += sprintf(afrbuf + alen, "  RX %s",
							  extra_m_info[cu.fd.flags & 3]);
			}

			alen += sprintf(afrbuf + alen, "%s  ", (color == 1) ? col_off : "");
			alen += snprintf_long_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, view);

			if ((view & CANLIB_VIEW_ERROR) && (cu.fd.can_id & CAN_ERR_FLAG)) {
				alen += sprintf(afrbuf + alen, "\n\t");
				alen += snprintf_can_error_frame(afrbuf + alen,
								 sizeof(afrbuf) - alen,
								 &cu.fd, "\n\t");
			}

			printf("%s%s\n", afrbuf, (color > 1) ? col_off : "");
out_fflush:
			fflush(stdout);
		}
	}

	for (i = 0; i < currmax; i++)
		close(sock_info[i].s);

	close(fd_epoll);

	if (log)
		fclose(logfile);

	if (signal_num)
		return 128 + signal_num;

	return 0;
}